

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O3

bool linenoise::linenoiseRaw(char *prompt,string *line)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char buf [4096];
  termios local_1018 [68];
  
  iVar2 = isatty(0);
  if (iVar2 == 0) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'h');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)line,cVar1);
  }
  else {
    iVar2 = isatty(0);
    if (iVar2 != 0) {
      if (atexit_registered == '\0') {
        atexit(linenoiseAtExit);
        atexit_registered = '\x01';
      }
      iVar2 = tcgetattr(0,(termios *)orig_termios);
      if (iVar2 != -1) {
        local_1018[0].c_cc[7] = orig_termios[0x18];
        local_1018[0].c_cc[8] = orig_termios[0x19];
        local_1018[0].c_cc[9] = orig_termios[0x1a];
        local_1018[0].c_cc[10] = orig_termios[0x1b];
        local_1018[0].c_cc[0xb] = orig_termios[0x1c];
        local_1018[0].c_cc[0xc] = orig_termios[0x1d];
        local_1018[0].c_cc[0xd] = orig_termios[0x1e];
        local_1018[0].c_cc[0xe] = orig_termios[0x1f];
        local_1018[0]._48_4_ = orig_termios._48_4_;
        local_1018[0].c_ispeed = orig_termios._52_4_;
        local_1018[0].c_ospeed = orig_termios._56_4_;
        local_1018[0]._0_8_ = orig_termios._0_8_ & 0xfffffffffffffacd;
        local_1018[0].c_cc[0xf] = orig_termios[0x20];
        local_1018[0].c_cc[0x10] = orig_termios[0x21];
        local_1018[0].c_cc[0x11] = orig_termios[0x22];
        local_1018[0].c_cc[0x12] = orig_termios[0x23];
        local_1018[0].c_cc[0x13] = orig_termios[0x24];
        local_1018[0].c_cc[0x14] = orig_termios[0x25];
        local_1018[0].c_cc[0x15] = orig_termios[0x26];
        local_1018[0].c_cc[0x16] = orig_termios[0x27];
        local_1018[0].c_cc[0x17] = orig_termios[0x28];
        local_1018[0].c_cc[0x18] = orig_termios[0x29];
        local_1018[0].c_cc[0x19] = orig_termios[0x2a];
        local_1018[0].c_cc[0x1a] = orig_termios[0x2b];
        local_1018[0].c_cc[0x1b] = orig_termios[0x2c];
        local_1018[0].c_cc[0x1c] = orig_termios[0x2d];
        local_1018[0].c_cc[0x1d] = orig_termios[0x2e];
        local_1018[0].c_cc[0x1e] = orig_termios[0x2f];
        local_1018[0]._8_8_ = orig_termios._8_8_ & 0xffff7ff4ffffffff | 0x30;
        local_1018[0]._16_6_ = (undefined6)orig_termios._16_8_;
        local_1018[0].c_cc._5_2_ = 0x100;
        iVar2 = tcsetattr(0,2,local_1018);
        if (-1 < iVar2) {
          rawmode = '\x01';
          iVar2 = linenoiseEdit(0,1,(char *)local_1018,0x1000,prompt);
          if (iVar2 != -1) {
            std::__cxx11::string::_M_replace
                      ((ulong)line,0,(char *)line->_M_string_length,(ulong)local_1018);
          }
          if ((rawmode == '\x01') && (iVar3 = tcsetattr(0,2,(termios *)orig_termios), iVar3 != -1))
          {
            rawmode = '\0';
          }
          putchar(10);
          return iVar2 == -1;
        }
      }
    }
    piVar4 = __errno_location();
    *piVar4 = 0x19;
  }
  return false;
}

Assistant:

inline bool linenoiseRaw(const char *prompt, std::string& line) {
    bool quit = false;

    if (!isatty(STDIN_FILENO)) {
        /* Not a tty: read from file / pipe. */
        std::getline(std::cin, line);
    } else {
        /* Interactive editing. */
        if (enableRawMode(STDIN_FILENO) == false) {
            return quit;
        }

        char buf[LINENOISE_MAX_LINE];
        auto count = linenoiseEdit(STDIN_FILENO, STDOUT_FILENO, buf, LINENOISE_MAX_LINE, prompt);
        if (count == -1) {
            quit = true;
        } else {
            line.assign(buf, count);
        }

        disableRawMode(STDIN_FILENO);
        printf("\n");
    }
    return quit;
}